

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O2

GetIndexDataStruct *
cfd::js::api::TransactionStructApi::GetTxInIndex
          (GetIndexDataStruct *__return_storage_ptr__,GetTxInIndexRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  local_f8;
  GetIndexDataStruct local_d8;
  
  GetIndexDataStruct::GetIndexDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:947:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:947:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"GetTxInIndex",&local_119);
  ExecuteStructApi<cfd::js::api::GetTxInIndexRequestStruct,cfd::js::api::GetIndexDataStruct>
            (&local_d8,(api *)request,(GetTxInIndexRequestStruct *)&local_118,&local_f8,in_R8);
  GetIndexDataStruct::operator=(__return_storage_ptr__,&local_d8);
  GetIndexDataStruct::~GetIndexDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

GetIndexDataStruct TransactionStructApi::GetTxInIndex(
    const GetTxInIndexRequestStruct& request) {
  auto call_func = [](const GetTxInIndexRequestStruct& request)
      -> GetIndexDataStruct {  // NOLINT
    GetIndexDataStruct response;
    TransactionContext ctx(request.tx);
    response.index = ctx.GetTxInIndex(Txid(request.txid), request.vout);
    response.ignore_items.insert("indexes");
    return response;
  };

  GetIndexDataStruct result;
  result = ExecuteStructApi<GetTxInIndexRequestStruct, GetIndexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}